

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralEvaporationSpectrum.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum::GeneralEvaporationSpectrum
          (GeneralEvaporationSpectrum *this,GeneralEvaporationSpectrum *param_1)

{
  TabulationRecord::TabulationRecord((TabulationRecord *)this,(TabulationRecord *)param_1);
  TabulationRecord::TabulationRecord
            (&(this->distribution_).super_TabulationRecord,
             &(param_1->distribution_).super_TabulationRecord);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT GeneralEvaporationSpectrum {

  EffectiveTemperature temperature_;
  DistributionFunction distribution_;

public:

  /* constructor */
  #include "ENDFtk/section/5/GeneralEvaporationSpectrum/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the distribution type (the LF flag)
   */
  static constexpr int LF() { return 5; }

  /**
   *  @brief Return the distribution type (the LF flag)
   */
  int LAW() const { return this->LF(); }

  /**
   *  @brief Return the effective temperature
   */
  const EffectiveTemperature& theta() const { return this->temperature_; }

  /**
   *  @brief Return the effective temperature
   */
  const EffectiveTemperature& effectiveTemperature() const {

    return this->theta();
  }

  /**
   *  @brief Return the distribution function g(x)
   */
  const DistributionFunction& g() const { return this->distribution_; }

  /**
   *  @brief Return the distribution function g(x)
   */
  const DistributionFunction& distributionFunction() const { return this->g(); }

  #include "ENDFtk/section/5/GeneralEvaporationSpectrum/src/NC.hpp"
  #include "ENDFtk/section/5/GeneralEvaporationSpectrum/src/print.hpp"
}